

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::OnDelegateExpr(NameApplier *this,TryExpr *expr)

{
  string_view name;
  string_view label;
  TryExpr *expr_local;
  NameApplier *this_local;
  
  PopLabel(this);
  name = FindLabelByVar(this,&expr->delegate_target);
  UseNameForVar(this,name,&expr->delegate_target);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::OnDelegateExpr(TryExpr* expr) {
  PopLabel();
  std::string_view label = FindLabelByVar(&expr->delegate_target);
  UseNameForVar(label, &expr->delegate_target);
  return Result::Ok;
}